

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# callback.h
# Opt level: O3

void __thiscall
booster::callback<void_(const_std::error_code_&,_unsigned_long)>::callback<cancel_once>
          (callback<void_(const_std::error_code_&,_unsigned_long)> *this,cancel_once func)

{
  callable<void_(const_std::error_code_&,_unsigned_long)> *pcVar1;
  
  pcVar1 = (callable<void_(const_std::error_code_&,_unsigned_long)> *)operator_new(0x20);
  (pcVar1->super_refcounted)._vptr_refcounted = (_func_int **)&PTR__refcounted_00116b50;
  booster::atomic_counter::atomic_counter(&(pcVar1->super_refcounted).refs_,0);
  (pcVar1->super_refcounted)._vptr_refcounted = (_func_int **)&PTR__refcounted_00116bb0;
  pcVar1[1].super_refcounted._vptr_refcounted = (_func_int **)func.sock;
  *(long *)&pcVar1[1].super_refcounted.refs_ = func._8_8_;
  (this->call_ptr).p_ = pcVar1;
  booster::atomic_counter::inc();
  return;
}

Assistant:

callback(F func) : call_ptr(new callable_impl<Result,F>(func)) 	
		{}